

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O3

Amap_Cut_t * Amap_ManCutStore(Amap_Man_t *p,Amap_Cut_t *pCut,int fCompl)

{
  ushort uVar1;
  Amap_Cut_t AVar2;
  Amap_Cut_t *pAVar3;
  Amap_Cut_t *pAVar4;
  uint uVar5;
  uint uVar6;
  
  pAVar3 = (Amap_Cut_t *)Aig_MmFlexEntryFetch(p->pMemTemp,((uint)*pCut >> 0x11) * 4 + 0xc);
  uVar1 = *(ushort *)pCut;
  AVar2._2_2_ = *(undefined2 *)&pAVar3->field_0x2;
  AVar2._0_2_ = uVar1;
  *pAVar3 = AVar2;
  uVar6 = fCompl << 0x10 ^ (uint)*pCut;
  uVar5 = uVar6 & 0x10000;
  *pAVar3 = (Amap_Cut_t)((uint)AVar2 & 0xfffeffff | uVar5);
  AVar2 = (Amap_Cut_t)((uint)*pCut & 0xfffe0000 | (uint)uVar1 | uVar5);
  *pAVar3 = AVar2;
  memcpy(pAVar3 + 1,pCut + 1,(ulong)((uint)*pCut >> 0xf & 0xfffffffc));
  uVar5 = (uVar6 >> 0x10 & 1) + (uint)uVar1 * 2;
  pAVar4 = p->ppCutsTemp[uVar5];
  if (pAVar4 == (Amap_Cut_t *)0x0) {
    Vec_IntPushOrder(p->vTemp,uVar5);
    pAVar4 = p->ppCutsTemp[uVar5];
    AVar2 = *pAVar3;
  }
  *(Amap_Cut_t **)(pAVar3 + (ulong)((uint)AVar2 >> 0x11) + 1) = pAVar4;
  p->ppCutsTemp[uVar5] = pAVar3;
  return pAVar3;
}

Assistant:

Amap_Cut_t * Amap_ManCutStore( Amap_Man_t * p, Amap_Cut_t * pCut, int fCompl )
{
    Amap_Cut_t * pNew;
    int iFan, nBytes = sizeof(Amap_Cut_t) + sizeof(int) * pCut->nFans + sizeof(Amap_Cut_t *);
    pNew = (Amap_Cut_t *)Aig_MmFlexEntryFetch( p->pMemTemp, nBytes );
    pNew->iMat  = pCut->iMat;
    pNew->fInv  = pCut->fInv ^ fCompl;
    pNew->nFans = pCut->nFans;
    memcpy( pNew->Fans, pCut->Fans, sizeof(int) * pCut->nFans );
    // add it to storage
    iFan = Abc_Var2Lit( pNew->iMat, pNew->fInv );
    if ( p->ppCutsTemp[ iFan ] == NULL )
        Vec_IntPushOrder( p->vTemp, iFan );
    *Amap_ManCutNextP( pNew ) = p->ppCutsTemp[ iFan ];
    p->ppCutsTemp[ iFan ] = pNew;
    return pNew;
}